

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

bool __thiscall QDockAreaLayoutInfo::updateTabBar(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutItem *this_00;
  QDockAreaLayoutItem *pQVar1;
  QTabBar *pQVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  QMainWindowLayout *this_01;
  QTabBar *pQVar8;
  quintptr id;
  long lVar9;
  undefined4 extraout_var;
  QMetaType QVar10;
  undefined8 uVar11;
  quintptr qVar12;
  QDockWidgetGroupWindow *this_02;
  uint uVar13;
  long lVar14;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QStringView QVar18;
  QStringView QVar19;
  QMetaTypeInterface *local_d8;
  QString local_a8;
  QMetaType local_88;
  QMetaType local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  byte local_60;
  undefined7 uStack_5f;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == true) {
    if (this->tabBar == (QTabBar *)0x0) {
      this_01 = qt_mainwindow_layout(this->mainWindow);
      pQVar8 = QMainWindowLayout::getTabBar((QMainWindowLayout *)this_01);
      this->tabBar = pQVar8;
      QTabBar::setShape(pQVar8,this->tabBarShape);
      QTabBar::setDrawBase(this->tabBar,true);
    }
    pQVar8 = this->tabBar;
    iVar16 = 0;
    if (pQVar8 != (QTabBar *)0x0) {
      QObject::blockSignals(SUB81(pQVar8,0));
    }
    id = currentTabId(this);
    uVar13 = 0;
    if ((this->item_list).d.size != 0) {
      lVar14 = 0;
      uVar17 = 0;
      bVar4 = 0;
      iVar16 = 0;
      do {
        pQVar1 = (this->item_list).d.ptr;
        this_00 = (QDockAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar14);
        bVar3 = QDockAreaLayoutItem::skip(this_00);
        if (!bVar3) {
          if ((*(byte *)((long)&pQVar1->flags + lVar14) & 1) == 0) {
            if (this_00->widgetItem != (QLayoutItem *)0x0) {
              (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
              lVar9 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
              lVar9 = *(long *)(lVar9 + 8);
              local_a8.d.d = *(Data **)(lVar9 + 0x290);
              local_a8.d.ptr = *(char16_t **)(lVar9 + 0x298);
              local_a8.d.size = *(long *)(lVar9 + 0x2a0);
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
              }
              if (this_00->widgetItem == (QLayoutItem *)0x0) {
                local_d8 = (QMetaTypeInterface *)0x0;
              }
              else {
                iVar6 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
                local_d8 = (QMetaTypeInterface *)CONCAT44(extraout_var,iVar6);
              }
              iVar6 = QTabBar::count(this->tabBar);
              if (iVar16 == iVar6) {
                QTabBar::insertTab(this->tabBar,iVar16,&local_a8);
                QTabBar::setTabToolTip(this->tabBar,iVar16,&local_a8);
                pQVar2 = this->tabBar;
                ::QVariant::QVariant((QVariant *)&local_58,(ulonglong)local_d8);
                QTabBar::setTabData(pQVar2,iVar16,(QVariant *)&local_58);
LAB_003fa58f:
                ::QVariant::~QVariant((QVariant *)&local_58);
              }
              else {
                paVar15 = &local_58;
                QTabBar::tabData((QVariant *)paVar15,this->tabBar,iVar16);
                local_80.d_ptr =
                     (QMetaTypeInterface *)
                     &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
                local_88.d_ptr =
                     (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
                bVar3 = comparesEqual(&local_88,&local_80);
                if (bVar3) {
                  uVar11 = local_58.shared;
                  if ((local_40 & 1) != 0) {
                    uVar11 = *(QMetaTypeInterface **)
                              (local_58.shared + (int)*(uint *)(local_58.shared + 4));
                  }
                }
                else {
                  local_88.d_ptr = (QMetaTypeInterface *)0x0;
                  QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
                  if ((local_40 & 1) != 0) {
                    paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                              (local_58.shared + (int)*(uint *)(local_58.shared + 4));
                  }
                  QMetaType::convert(QVar10,paVar15,local_80,&local_88);
                  uVar11 = local_88.d_ptr;
                }
                ::QVariant::~QVariant((QVariant *)&local_58);
                if ((QMetaTypeInterface *)uVar11 != local_d8) {
                  iVar6 = iVar16 + 1;
                  iVar7 = QTabBar::count(this->tabBar);
                  if (iVar6 < iVar7) {
                    paVar15 = &local_78;
                    QTabBar::tabData((QVariant *)paVar15,this->tabBar,iVar6);
                    local_58.shared =
                         (PrivateShared *)
                         &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
                    local_80.d_ptr =
                         (QMetaTypeInterface *)(CONCAT71(uStack_5f,local_60) & 0xfffffffffffffffc);
                    bVar3 = comparesEqual(&local_80,(QMetaType *)&local_58.shared);
                    if (bVar3) {
                      uVar11 = local_78.shared;
                      if ((local_60 & 1) != 0) {
                        uVar11 = *(QMetaTypeInterface **)
                                  (local_78.shared + (int)*(uint *)(local_78.shared + 4));
                      }
                    }
                    else {
                      local_80.d_ptr = (QMetaTypeInterface *)0x0;
                      QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
                      if ((local_60 & 1) != 0) {
                        paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                                  (local_78.shared + (int)*(uint *)(local_78.shared + 4));
                      }
                      QMetaType::convert(QVar10,paVar15,(QMetaType)local_58.shared,&local_80);
                      uVar11 = local_80.d_ptr;
                    }
                    bVar3 = (QMetaTypeInterface *)uVar11 == local_d8;
                  }
                  else {
                    bVar3 = false;
                  }
                  if (iVar6 < iVar7) {
                    ::QVariant::~QVariant((QVariant *)&local_78);
                  }
                  if (!bVar3) {
                    QTabBar::insertTab(this->tabBar,iVar16,&local_a8);
                    QTabBar::setTabToolTip(this->tabBar,iVar16,&local_a8);
                    pQVar2 = this->tabBar;
                    ::QVariant::QVariant((QVariant *)&local_58,(ulonglong)local_d8);
                    QTabBar::setTabData(pQVar2,iVar16,(QVariant *)&local_58);
                    goto LAB_003fa58f;
                  }
                  QTabBar::removeTab(this->tabBar,iVar16);
                }
              }
              QTabBar::tabText((QString *)&local_58,this->tabBar,iVar16);
              bVar5 = 1;
              if (local_a8.d.size == local_58._16_8_) {
                QVar18.m_data = local_a8.d.ptr;
                QVar18.m_size = local_a8.d.size;
                QVar19.m_data = (storage_type_conflict *)local_58._8_8_;
                QVar19.m_size = local_58._16_8_;
                bVar5 = QtPrivate::equalStrings(QVar18,QVar19);
                bVar5 = bVar5 ^ 1;
              }
              if ((QMetaTypeInterface *)local_58.shared != (QMetaTypeInterface *)0x0) {
                LOCK();
                *(int *)local_58.shared = *(int *)local_58.shared + -1;
                UNLOCK();
                if (*(int *)local_58.shared == 0) {
                  QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
                }
              }
              if (bVar5 != 0) {
                QTabBar::setTabText(this->tabBar,iVar16,&local_a8);
                QTabBar::setTabToolTip(this->tabBar,iVar16,&local_a8);
              }
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              iVar16 = iVar16 + 1;
            }
          }
          else {
            bVar4 = 1;
          }
        }
        uVar17 = uVar17 + 1;
        lVar14 = lVar14 + 0x28;
      } while (uVar17 < (ulong)(this->item_list).d.size);
      uVar13 = (uint)bVar4;
    }
    while (iVar6 = QTabBar::count(this->tabBar), iVar16 < iVar6) {
      QTabBar::removeTab(this->tabBar,iVar16);
    }
    if ((id != 0) && (qVar12 = currentTabId(this), qVar12 != id)) {
      setCurrentTabId(this,id);
    }
    this_02 = (QDockWidgetGroupWindow *)
              QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    if (this_02 != (QDockWidgetGroupWindow *)0x0) {
      QDockWidgetGroupWindow::adjustFlags(this_02);
    }
    iVar16 = QTabBar::count(this->tabBar);
    bVar3 = 1 < (int)(iVar16 + uVar13);
    if (pQVar8 != (QTabBar *)0x0) {
      QObject::blockSignals(SUB81(pQVar8,0));
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QDockAreaLayoutInfo::updateTabBar() const
{
    if (!tabbed)
        return false;

    QDockAreaLayoutInfo *that = const_cast<QDockAreaLayoutInfo*>(this);

    if (that->tabBar == nullptr) {
        that->tabBar = mainWindowLayout()->getTabBar();
        that->tabBar->setShape(static_cast<QTabBar::Shape>(tabBarShape));
        that->tabBar->setDrawBase(true);
    }

    const QSignalBlocker blocker(tabBar);
    bool gap = false;

    const quintptr oldCurrentId = currentTabId();

    int tab_idx = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;
        if (item.flags & QDockAreaLayoutItem::GapItem) {
            gap = true;
            continue;
        }
        if (item.widgetItem == nullptr)
            continue;

        QDockWidget *dw = qobject_cast<QDockWidget*>(item.widgetItem->widget());
        QString title = dw->d_func()->fixedWindowTitle;
        quintptr id = tabId(item);
        if (tab_idx == tabBar->count()) {
            tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
            tabBar->setTabData(tab_idx, id);
        } else if (qvariant_cast<quintptr>(tabBar->tabData(tab_idx)) != id) {
            if (tab_idx + 1 < tabBar->count()
                    && qvariant_cast<quintptr>(tabBar->tabData(tab_idx + 1)) == id)
                tabBar->removeTab(tab_idx);
            else {
                tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
                tabBar->setTabToolTip(tab_idx, title);
#endif
                tabBar->setTabData(tab_idx, id);
            }
        }

        if (title != tabBar->tabText(tab_idx)) {
            tabBar->setTabText(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
        }

        ++tab_idx;
    }

    while (tab_idx < tabBar->count()) {
        tabBar->removeTab(tab_idx);
    }

    if (oldCurrentId > 0 && currentTabId() != oldCurrentId)
        that->setCurrentTabId(oldCurrentId);

    if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(tabBar->parent()))
        dwgw->adjustFlags();

    //returns if the tabbar is visible or not
    return ( (gap ? 1 : 0) + tabBar->count()) > 1;
}